

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::resizeColumnToContents(QTreeView *this,int column)

{
  QAbstractItemViewPrivate *this_00;
  int iVar1;
  int iVar2;
  QHeaderView *this_01;
  
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_00->delayedPendingLayout == true) && (this_00->state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(this_00);
    (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if (-1 < column) {
    iVar1 = QHeaderView::count(*(QHeaderView **)
                                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x50);
    if (column < iVar1) {
      iVar2 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x200))(this,column);
      this_01 = *(QHeaderView **)
                 &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                  super_QWidgetPrivate.field_0x50;
      iVar1 = 0;
      if ((((this_01->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
           data)->widget_attributes & 0x10000) == 0) {
        iVar1 = QHeaderView::sectionSizeHint(this_01,column);
        this_01 = *(QHeaderView **)
                   &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                    super_QWidgetPrivate.field_0x50;
      }
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      QHeaderView::resizeSection(this_01,column,iVar1);
      return;
    }
  }
  return;
}

Assistant:

void QTreeView::resizeColumnToContents(int column)
{
    Q_D(QTreeView);
    d->executePostedLayout();
    if (column < 0 || column >= d->header->count())
        return;
    int contents = sizeHintForColumn(column);
    int header = d->header->isHidden() ? 0 : d->header->sectionSizeHint(column);
    d->header->resizeSection(column, qMax(contents, header));
}